

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O3

IOConversionPtr
create_conversion(FFSTypeHandle_conflict src_ioformat,FMFieldList target_field_list,
                 int target_struct_size,int pointer_size,int byte_reversal,
                 FMfloat_format target_fp_format,IOconversion_type initial_conversion,
                 int target_column_major,int string_offset_size,int converted_strings,
                 FMStructDescList target_list)

{
  FMVarInfoList p_Var1;
  FMFormat_conflict p_Var2;
  FMVarInfoList p_Var3;
  FFSTypeHandle_conflict src_ioformat_00;
  IOConversionPtr_conflict p_Var4;
  IOconvFieldStruct *pIVar5;
  FMVarInfoList p_Var6;
  uint uVar7;
  int iVar8;
  FMdata_type FVar9;
  FMdata_type FVar10;
  IOconversion_type IVar11;
  int iVar12;
  IOConversionPtr conv;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  void *pvVar17;
  IOConversionPtr p_Var18;
  conv_routine p_Var19;
  ulong uVar20;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  FMVarInfoList extraout_RDX;
  FMVarInfoList extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar21;
  undefined8 extraout_RDX_02;
  FMVarInfoList p_Var22;
  FMVarInfoList extraout_RDX_03;
  FMVarInfoList extraout_RDX_04;
  FMVarInfoList extraout_RDX_05;
  FMVarInfoList extraout_RDX_06;
  FMFieldList p_Var23;
  char *pcVar24;
  FFSTypeHandle_conflict str;
  ulong uVar25;
  long *plVar26;
  long lVar27;
  ulong uVar28;
  FMVarInfoStruct *pFVar29;
  bool bVar30;
  bool bVar31;
  double dVar32;
  undefined4 in_stack_0000001c;
  FMStructDescList in_stack_fffffffffffffef8;
  FMVarInfoList local_f0;
  FMfloat_format local_e4;
  void *local_c8;
  long in_elements;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong local_a8;
  ulong local_a0;
  IOconvFieldStruct *local_98;
  ulong local_90;
  FMFieldList local_88;
  int local_80;
  FMfloat_format local_7c;
  long target_elements;
  size_t local_70;
  ulong local_68;
  FMFieldList local_60;
  FMFieldList local_58;
  FMFieldList local_50;
  FFSTypeHandle *local_48;
  char *local_40;
  size_t local_38;
  
  local_70 = (size_t)target_column_major;
  local_b4 = byte_reversal;
  local_80 = pointer_size;
  uVar7 = count_FMfield(target_field_list);
  local_58 = copy_field_list(target_field_list);
  p_Var2 = src_ioformat->body;
  local_88 = p_Var2->field_list;
  p_Var3 = p_Var2->var_list;
  local_7c = p_Var2->float_format;
  conv = (IOConversionPtr)ffs_malloc((long)(int)uVar7 * 0x48 + 0xd8);
  p_Var23 = local_58;
  p_Var2 = src_ioformat->body;
  local_e4 = target_fp_format;
  if (target_fp_format == Format_Unknown) {
    local_e4 = ffs_my_float_format;
  }
  local_b0 = p_Var2->column_major_arrays;
  conv->notify_of_format_change = 0;
  conv->context = src_ioformat->context;
  local_48 = &conv->ioformat;
  conv->ioformat = src_ioformat;
  conv->base_size_delta = (long)target_struct_size - (long)p_Var2->record_length;
  conv->max_var_expansion = 1.0;
  conv->conv_count = 0;
  qsort(local_58,(long)(int)uVar7,0x18,field_offset_compar);
  conv->native_field_list = p_Var23;
  conv->target_pointer_size = local_80;
  conv->required_alignment = 8;
  conv->free_data = (void *)0x0;
  conv->free_func = (_func_void_void_ptr *)0x0;
  conv->conv_pkg = (char *)0x0;
  conv->conv_func = (conv_routine)0x0;
  conv->conv_func4 = (conv_routine)0x0;
  conv->conv_func2 = (conv_routine)0x0;
  conv->conv_func1 = (conv_routine)0x0;
  conv->string_offset_size = local_70;
  conv->converted_strings = 0;
  IVar11 = buffer_and_convert;
  if (buffer_and_convert < initial_conversion) {
    IVar11 = initial_conversion;
  }
  if (src_ioformat->body->record_length <= target_struct_size) {
    IVar11 = initial_conversion;
  }
  local_98 = conv->conversions;
  local_68 = (ulong)uVar7;
  local_60 = local_88 + 1;
  uVar20 = 0;
  p_Var22 = (FMVarInfoList)(ulong)IVar11;
  p_Var6 = (FMVarInfoList)(ulong)IVar11;
LAB_00110187:
  local_f0 = p_Var6;
  iVar12 = (int)p_Var22;
  if (0 < (int)uVar20) {
    lVar27 = 0;
    do {
      *(undefined8 *)((long)&conv->conversions[0].iovar + lVar27) = 0;
      pvVar17 = *(void **)((long)&conv->conversions[0].default_value + lVar27);
      if (pvVar17 != (void *)0x0) {
        free(pvVar17);
        p_Var22 = extraout_RDX;
      }
      p_Var18 = *(IOConversionPtr *)((long)&conv->conversions[0].subconversion + lVar27);
      if (p_Var18 != (IOConversionPtr)0x0) {
        FFSfree_conversion(p_Var18);
        p_Var22 = extraout_RDX_00;
      }
      iVar12 = (int)p_Var22;
      lVar27 = lVar27 + 0x48;
    } while ((uVar20 & 0xffffffff) * 0x48 != lVar27);
  }
  conv->conversion_type = (IOconversion_type)local_f0;
  if ((int)local_68 < 1) {
LAB_0011099e:
    p_Var19 = generate_conversion(conv,src_ioformat->body->alignment,iVar12);
    conv->conv_func = p_Var19;
    switch(conv->required_alignment) {
    case 0:
    case 8:
      break;
    case 1:
      conv->conv_func1 = p_Var19;
    case 2:
      conv->conv_func2 = p_Var19;
    case 4:
      conv->conv_func4 = p_Var19;
      break;
    default:
      uVar7 = conv->required_alignment - 0x10;
      if ((uVar7 < 0x31) && ((0x1000000010001U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
        return conv;
      }
    case 3:
    case 5:
    case 6:
    case 7:
      create_conversion_cold_1();
    }
    return conv;
  }
  uVar25 = 0;
  local_50 = local_60;
  uVar20 = 0;
  do {
    local_c8 = (void *)0x0;
    p_Var1 = (FMVarInfoList)(local_58 + uVar25);
    pcVar16 = local_58[uVar25].field_name;
    pcVar13 = strchr(pcVar16,0x28);
    local_90 = uVar20;
    if ((pcVar13 == (char *)0x0) || (conv->context->fmc->ignore_default_values != 0)) {
      pcVar13 = (char *)0x0;
      iVar12 = extraout_EDX;
    }
    else {
      sVar15 = strlen(pcVar16);
      pcVar13 = (char *)ffs_malloc(sVar15);
      pcVar16 = base_data_type(*(char **)&p_Var1->byte_vector);
      FVar9 = FMstr_to_data_type(pcVar16);
      strncpy(pcVar13,*(char **)p_Var1,0x80);
      pcVar24 = strchr(pcVar13,0x28);
      local_c8 = (void *)0x0;
      free(pcVar16);
      pcVar16 = pcVar13;
      iVar12 = extraout_EDX_00;
      if (pcVar24 != (char *)0x0) {
        *pcVar24 = '\0';
        pcVar24 = pcVar24 + 1;
        pcVar14 = strchr(pcVar24,0x29);
        if (pcVar14 != (char *)0x0) {
          *pcVar14 = '\0';
        }
        iVar12 = extraout_EDX_01;
        if (0 < (int)pcVar14 - (int)pcVar24) {
          str_to_val(pcVar24,FVar9,p_Var1->dimen_count,&local_c8);
          iVar12 = extraout_EDX_02;
        }
      }
    }
    local_a0 = uVar25;
    if (uVar25 < 0xb) {
LAB_00110451:
      pcVar24 = local_88->field_name;
      if (pcVar24 != (char *)0x0) {
        uVar28 = 0;
        p_Var23 = local_60;
        while (iVar8 = strcmp(pcVar16,pcVar24), iVar12 = extraout_EDX_03, iVar8 != 0) {
          uVar28 = uVar28 + 1;
          pcVar24 = p_Var23->field_name;
          p_Var23 = p_Var23 + 1;
          if (pcVar24 == (char *)0x0) goto LAB_00110948;
        }
        goto LAB_0011037b;
      }
LAB_00110948:
      if (local_c8 == (void *)0x0) {
        create_conversion_cold_2();
        return (IOConversionPtr)0x0;
      }
      if (((uint)local_f0 & 0xfffffffe) == 2) goto LAB_0011099e;
      free(local_c8);
      local_c8 = (void *)0x0;
      uVar20 = local_90;
      p_Var22 = extraout_RDX_05;
      p_Var6 = (FMVarInfoList)0x2;
      if (pcVar13 != (char *)0x0) {
        free(pcVar13);
        uVar20 = local_90;
        p_Var22 = extraout_RDX_06;
      }
      goto LAB_00110187;
    }
    uVar20 = (long)(int)uVar25;
    do {
      uVar28 = uVar20 & 0xffffffff;
      iVar8 = strcmp(pcVar16,local_88[uVar28].field_name);
      iVar12 = (int)extraout_RDX_01;
      if (iVar8 == 0) goto LAB_0011037b;
      bVar30 = (long)(uVar25 - 9) < (long)uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar30);
    uVar20 = local_a0 + 9;
    uVar21 = extraout_RDX_01;
    p_Var23 = local_50;
    uVar28 = local_a0;
    do {
      iVar12 = (int)uVar21;
      if ((uVar20 <= uVar28) || (p_Var23->field_name == (char *)0x0)) goto LAB_00110451;
      iVar8 = strcmp(pcVar16,p_Var23->field_name);
      iVar12 = (int)extraout_RDX_02;
      p_Var23 = p_Var23 + 1;
      uVar28 = uVar28 + 1;
      uVar21 = extraout_RDX_02;
    } while (iVar8 != 0);
LAB_0011037b:
    if ((int)uVar28 == -1) goto LAB_00110948;
    if (pcVar13 != (char *)0x0) {
      free(pcVar13);
    }
    if (local_c8 != (void *)0x0) {
      free(local_c8);
      local_c8 = (void *)0x0;
    }
    uVar28 = (ulong)(int)uVar28;
    local_40 = local_88[uVar28].field_name;
    str = (FFSTypeHandle_conflict)local_88[uVar28].field_type;
    iVar12 = local_88[uVar28].field_size;
    local_38 = (size_t)local_88[uVar28].field_offset;
    local_a8 = uVar28;
    FVar9 = FMarray_str_to_data_type((char *)str,&in_elements);
    lVar27 = in_elements;
    bVar30 = false;
    if (in_elements != 1) {
      sVar15 = strlen((char *)str);
      pcVar16 = (char *)memchr(str,0x5b,sVar15);
      if (pcVar16 == (char *)0x0) {
        bVar30 = false;
      }
      else {
        sVar15 = strlen(pcVar16);
        pvVar17 = memchr(pcVar16 + 1,0x5b,sVar15);
        bVar30 = pvVar17 != (void *)0x0;
      }
      if (lVar27 == -1) {
        in_elements = 1;
      }
    }
    FVar10 = FMarray_str_to_data_type(*(char **)&p_Var1->byte_vector,&target_elements);
    if (target_elements == -1) {
      target_elements = 1;
    }
    local_ac = iVar12;
    if ((uint)local_f0 < 2) {
      p_Var22 = (FMVarInfoList)(ulong)*(uint *)&p_Var1->field_0x14;
      uVar20 = local_90;
      p_Var6 = (FMVarInfoList)0x2;
      if (*(uint *)&p_Var1->field_0x14 != local_88[uVar28].field_offset) goto LAB_00110187;
      if (in_elements != target_elements) {
LAB_001105e3:
        uVar20 = local_90;
        if ((in_elements != 1) && (p_Var1->dimen_count != local_ac)) goto LAB_00110187;
        if ((local_b0 != 0) && (bVar30)) break;
        if ((((FVar9 == unknown_type) && (p_Var3[local_a8].var_array == 0)) &&
            (p_Var3[local_a8].type_desc.type != FMType_pointer)) &&
           ((src_ioformat->field_subformats[local_a8] != (FFSTypeHandle_conflict)0x0 &&
            (p_Var4 = src_ioformat->field_subformats[local_a8]->conversion,
            p_Var4 != (IOConversionPtr_conflict)0x0)))) {
          IVar11 = p_Var4->conversion_type;
          p_Var22 = p_Var3;
          uVar25 = local_a0;
          if (IVar11 == none_required) goto LAB_001108ce;
          if (IVar11 == direct_to_mem) {
            local_f0._0_4_ = 1;
          }
          else {
            p_Var6 = (FMVarInfoList)(ulong)IVar11;
            if (IVar11 == buffer_and_convert) goto LAB_00110187;
          }
        }
LAB_0011062b:
        iVar12 = p_Var3[local_a8].var_array;
        if ((iVar12 == 0) && (p_Var3[local_a8].type_desc.type != FMType_pointer)) {
LAB_00110658:
          if (p_Var3[local_a8].type_desc.type != FMType_pointer) goto LAB_001106a2;
        }
        else {
          p_Var22 = p_Var3;
          if (p_Var1->dimen_count != local_ac) break;
LAB_00110649:
          if (iVar12 == 0) goto LAB_00110658;
        }
        uVar7 = p_Var1->dimen_count - 1;
        iVar12 = 8;
        if (uVar7 < 7) {
          iVar12 = *(int *)(&DAT_001393f8 + (ulong)uVar7 * 4);
        }
        dVar32 = (double)(iVar12 + p_Var1->dimen_count) / (double)local_ac;
        if (conv->max_var_expansion <= dVar32 && dVar32 != conv->max_var_expansion) {
          conv->max_var_expansion = dVar32;
        }
        goto LAB_001106a2;
      }
      if ((((local_b4 != 0) || (FVar9 == unknown_type)) || (FVar9 != FVar10)) ||
         (FVar9 == float_type && local_e4 != local_7c)) goto LAB_001105e3;
      bVar31 = local_b0 != 0;
      iVar12 = field_is_flat(src_ioformat->body,&p_Var3[local_a8].type_desc);
      p_Var22 = extraout_RDX_03;
      if (((iVar12 == 0) || ((bool)(bVar31 & bVar30))) ||
         (uVar25 = local_a0, uVar20 = local_90, p_Var1->dimen_count != local_ac)) goto LAB_001105e3;
    }
    else {
      if ((uint)local_f0 == 2) goto LAB_0011062b;
      if ((uint)local_f0 == 3) {
        iVar12 = p_Var3[local_a8].var_array;
        local_f0._0_4_ = 3;
        goto LAB_00110649;
      }
LAB_001106a2:
      if ((in_elements != target_elements) || (FVar9 != FVar10)) {
        pcVar16 = *(char **)p_Var1;
        pcVar13 = *(char **)&p_Var1->byte_vector;
        pcVar24 = "Requested field %s base type %s \n   differs from source type %s\n\n";
LAB_00110a7a:
        fprintf(_stderr,pcVar24,pcVar16,pcVar13,str);
        FFSfree_conversion(conv);
        return (IOConversionPtr)0x0;
      }
      IVar11 = (uint)local_f0 + ((uint)local_f0 == 0);
      local_f0 = (FMVarInfoList)(ulong)IVar11;
      conv->conversion_type = IVar11;
      lVar27 = (long)(int)local_90;
      pIVar5 = local_98 + lVar27;
      (pIVar5->src_field).byte_swap = '\0';
      (pIVar5->src_field).src_float_format = '\0';
      (pIVar5->src_field).target_float_format = '\0';
      *(undefined5 *)&(pIVar5->src_field).field_0x13 = 0;
      *(undefined8 *)(&(pIVar5->src_field).byte_swap + 8) = 0;
      pIVar5 = local_98 + lVar27;
      (pIVar5->src_field).offset = 0;
      (pIVar5->src_field).size = 0;
      (pIVar5->src_field).data_type = unknown_type;
      local_98[lVar27].src_field.byte_swap = (uchar)local_b4;
      local_98[lVar27].src_field.src_float_format = (uchar)local_7c;
      local_98[lVar27].src_field.target_float_format = (uchar)local_e4;
      local_98[lVar27].subconversion = (IOConversionPtr)0x0;
      local_98[lVar27].rc_swap = no_row_column_swap;
      if ((local_b0 != 0) && (bVar30)) {
        local_98[lVar27].rc_swap =
             (src_ioformat->body->column_major_arrays == 0) + swap_source_column_major;
      }
      pIVar5 = local_98 + lVar27;
      FVar9 = FMarray_str_to_data_type((char *)str,&in_elements);
      pFVar29 = p_Var3 + local_a8;
      pIVar5->iovar = pFVar29;
      if (FVar9 == unknown_type) {
        src_ioformat_00 = src_ioformat->field_subformats[local_a8];
        if (src_ioformat_00 == (FFSTypeHandle_conflict)0x0) {
          pcVar13 = src_ioformat->body->field_list[uVar28].field_type;
          pcVar24 = "Unknown field type for field %s ->\"%s\", format %p\n";
          pcVar16 = local_40;
          str = src_ioformat;
          goto LAB_00110a7a;
        }
        local_a8 = local_a8 & 0xffffffff00000000;
        pcVar13 = base_data_type((char *)str);
        plVar26 = (long *)CONCAT44(in_stack_0000001c,string_offset_size);
        pcVar16 = (char *)*plVar26;
        while ((pcVar16 != (char *)0x0 && (iVar12 = strcmp(pcVar13,pcVar16), iVar12 != 0))) {
          pcVar16 = (char *)plVar26[4];
          plVar26 = plVar26 + 4;
        }
        pIVar5 = local_98 + lVar27;
        iVar12 = 0x1107f0;
        free(pcVar13);
        p_Var18 = conv;
        if (src_ioformat_00 != src_ioformat) {
          FVar9 = (FMdata_type)local_a8;
          if (*plVar26 == 0) goto LAB_00110865;
          p_Var18 = create_conversion(src_ioformat_00,(FMFieldList)plVar26[1],(int)plVar26[2],
                                      local_80,local_b4,local_e4,IVar11,(int)local_70,
                                      string_offset_size,iVar12,in_stack_fffffffffffffef8);
          if (pIVar5->subconversion != (IOConversionPtr)0x0) {
            puts("Subconversion already had value!");
          }
        }
        pIVar5->subconversion = p_Var18;
        FVar9 = (FMdata_type)local_a8;
      }
LAB_00110865:
      uVar25 = local_a0;
      if (pFVar29->var_array != 0) {
        in_elements = 1;
      }
      pIVar5 = local_98 + lVar27;
      (pIVar5->src_field).data_type = FVar9;
      (pIVar5->src_field).offset = local_38;
      (pIVar5->src_field).size = local_ac;
      pIVar5->dest_size = p_Var1->dimen_count;
      pIVar5->dest_offset = (long)*(int *)&p_Var1->field_0x14;
      pIVar5->default_value = (void *)0x0;
      uVar7 = (int)local_90 + 1;
      conv->conv_count = uVar7;
      p_Var22 = p_Var1;
      uVar20 = (ulong)uVar7;
      if (local_c8 != (void *)0x0) {
        free(local_c8);
        p_Var22 = extraout_RDX_04;
      }
    }
LAB_001108ce:
    iVar12 = (int)p_Var22;
    uVar25 = uVar25 + 1;
    local_50 = local_50 + 1;
    if (uVar25 == local_68) goto LAB_0011099e;
  } while( true );
  uVar20 = local_90;
  p_Var6 = (FMVarInfoList)0x3;
  goto LAB_00110187;
}

Assistant:

static
IOConversionPtr
create_conversion(FFSTypeHandle src_ioformat, FMFieldList target_field_list, int target_struct_size, int pointer_size,
		  int byte_reversal, FMfloat_format target_fp_format, IOconversion_type initial_conversion,
		  int target_column_major, int string_offset_size, int converted_strings, FMStructDescList target_list)
{
    int target_field_count = count_FMfield(target_field_list);
    FMFieldList nfl_sort = copy_field_list(target_field_list);
    FMFieldList input_field_list = src_ioformat->body->field_list;
    FMVarInfoList input_var_list = src_ioformat->body->var_list;
    IOconversion_type conv = initial_conversion;
    int input_index, conv_index = 0, i = 0;
    FMfloat_format src_float_format = src_ioformat->body->float_format;
    IOConversionPtr conv_ptr =
	(IOConversionPtr) malloc(sizeof(IOConversionStruct) +
				 target_field_count * sizeof(IOconvFieldStruct));
    int column_row_swap_necessary = (target_column_major != src_ioformat->body->column_major_arrays);
    
    if (target_fp_format == Format_Unknown) target_fp_format = ffs_my_float_format;

    conv_ptr->notify_of_format_change = 0;
    conv_ptr->context = src_ioformat->context;
    conv_ptr->ioformat = src_ioformat;
    conv_ptr->base_size_delta = target_struct_size -
	src_ioformat->body->record_length;
    conv_ptr->max_var_expansion = 1.0;
    conv_ptr->conv_count = 0;
    qsort(nfl_sort, target_field_count, sizeof(nfl_sort[0]),
	  field_offset_compar);
    conv_ptr->native_field_list = nfl_sort;
    conv_ptr->target_pointer_size = pointer_size;
    conv_ptr->required_alignment = 8; /* placeholder */
    conv_ptr->free_data = NULL;
    conv_ptr->free_func = NULL;
    conv_ptr->conv_func = NULL;
    conv_ptr->conv_func4 = NULL;
    conv_ptr->conv_func2 = NULL;
    conv_ptr->conv_func1 = NULL;
    conv_ptr->conv_pkg = NULL;
    conv_ptr->string_offset_size = string_offset_size;
    conv_ptr->converted_strings = converted_strings;

    /* 
     * We assume that the fields listed in the target_field_list are
     * those that the user is interested in.  Skipping input fields
     * is OK... 
     */

    if (src_ioformat->body->record_length > target_struct_size) {
	/* if input record is larger than target record, must do buffered */
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    conv = buffer_and_convert;
	    break;
	case buffer_and_convert:
	case copy_dynamic_portion:
	    break;
	default:
	    assert(FALSE);
	}
    }
    /* try for no conversion/direct_to_memory first.. */
  restart:
    if (conv_index > 0) {
	/* really a restart, NULL a couple of things */
	int i = 0;
	for (i=0; i < conv_index; i++) {
	    conv_ptr->conversions[i].iovar = NULL;
	    if (conv_ptr->conversions[i].default_value) {
		free(conv_ptr->conversions[i].default_value);
	    }
	    if (conv_ptr->conversions[i].subconversion) {
		FFSfree_conversion(conv_ptr->conversions[i].subconversion);
	    }
	}
    }
    conv_ptr->conversion_type = conv;
    input_index = conv_index = 0;
    for (i = 0; i < target_field_count; i++) {
	FMField input_field;
	FMdata_type in_data_type, target_data_type;
	long in_elements, target_elements;
	void *default_val = NULL;
	char *tmp_field_name = NULL;
	char *search_name;
	int multi_dimen_array = 0;

	/* 
	 * all fields in the target list must appear at the same offset
	 * as in the input list.
	 */
	input_index = 0;
	
	if ((strchr(nfl_sort[i].field_name, '(') == NULL) || conv_ptr->context->fmc->ignore_default_values) {
	    /* no default value */
	    search_name = (char *) nfl_sort[i].field_name;
	} else {
	    tmp_field_name = malloc(strlen(nfl_sort[i].field_name)); /* certainly big enough */
	    field_name_strip_get_default(&nfl_sort[i], tmp_field_name, &default_val);
	    search_name = tmp_field_name;
	}
	input_index = find_field_for_conv(search_name, input_field_list, i, NULL);
	if (input_index == -1) {
	    if(default_val){
	        if ((conv == buffer_and_convert) || 
		    (conv == copy_dynamic_portion)) {
		    input_index = -1; /* Basically invalidating input_index
				   Indication for using default_val */
		    break;
		} else {
		    if (default_val) {
		        free(default_val);
			default_val = NULL;
		    }
		    conv = buffer_and_convert;
		    if (tmp_field_name) free(tmp_field_name);
		    goto restart;
		}
	    }
	    fprintf(stderr,
		    "Requested field %s missing from input format\n",
		    nfl_sort[i].field_name);
	    FFSfree_conversion(conv_ptr);
	    if (tmp_field_name) free(tmp_field_name);
	    return NULL;
	}
	if (tmp_field_name) free(tmp_field_name);
	if(input_index == -1){
	    create_default_conversion(nfl_sort[i], default_val, &conv_ptr, 
				      conv_index);
	    conv_ptr->conversion_type = conv;
	    conv_ptr->conv_count = ++conv_index;
	    continue;
	} else {
	    if (default_val) {
		free(default_val);
		default_val = NULL;
	    }
	}
	input_field = input_field_list[input_index];
	in_data_type = FMarray_str_to_data_type(input_field.field_type,
					      &in_elements);
	if (in_elements != 1) {
	    char *first_bracket = memchr(input_field.field_type, '[', strlen(input_field.field_type));
	    if (first_bracket != NULL) {
		char *sec_bracket = memchr(first_bracket+1, '[', strlen(first_bracket));
		if (sec_bracket) multi_dimen_array++;
	    }
	}
	    
	if (in_elements == -1) {
	    in_elements = 1;	/* var array */
	}
	target_data_type = FMarray_str_to_data_type(nfl_sort[i].field_type,
						  &target_elements);
	if (target_elements == -1) {
	    target_elements = 1;	/* var array */
	}
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    if (nfl_sort[i].field_offset !=
		input_field_list[input_index].field_offset) {

		/* 
		 * we were planning direct to memory transfer, but found a 
		 * field that we couldn't do that way.   start over
		 * planning buffer and convert. 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if ((in_elements == target_elements) &&
		(in_data_type == target_data_type) &&
		(in_data_type != unknown_type) &&
		(!byte_reversal) &&
		((in_data_type != float_type) ||
		 (target_fp_format == src_float_format)) &&
		field_is_flat(src_ioformat->body, 
			      &input_var_list[input_index].type_desc) &&
		(!column_row_swap_necessary || !multi_dimen_array) &&
		(nfl_sort[i].field_size == input_field.field_size)) {
		/* nothing to do for this field */
		continue;
	    }
	    if ((in_elements != 1) &&
		(nfl_sort[i].field_size != input_field.field_size)) {
		/* Can't do direct to memory with array field interleaving 
		 * 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if (column_row_swap_necessary && multi_dimen_array) {
		/* Can't transpose an array in place
		 * 
		 */
		conv = copy_dynamic_portion;
		goto restart;
	    }

	    if ((in_data_type == unknown_type) && 
		!input_var_list[input_index].var_array &&
		(input_var_list[input_index].type_desc.type != FMType_pointer)) {
		FFSTypeHandle format = src_ioformat->field_subformats[input_index];
		if ((format != NULL) && (format->conversion != NULL)) {
		    switch (format->conversion->conversion_type) {
		    case copy_dynamic_portion:
			assert(conv == copy_dynamic_portion);
			break;
		    case buffer_and_convert:
			conv = buffer_and_convert;
			goto restart;
		    case direct_to_mem:
			conv = direct_to_mem;
			break;
		    case none_required:
			continue;
		    }
		}
	    }
	    /* falling through */
	case buffer_and_convert:
	    if (input_var_list[input_index].var_array ||
	    	(input_var_list[input_index].type_desc.type == FMType_pointer)) {
	    	if (nfl_sort[i].field_size != input_field.field_size) {
	    	    /* argh.  Must buffer variant part too */
	    	    conv = copy_dynamic_portion;
	    	    goto restart;
	    	}
	    }
	case copy_dynamic_portion:
	    if (input_var_list[input_index].var_array ||
		(input_var_list[input_index].type_desc.type == FMType_pointer)) {
		/* 
		 * expansion value includes padding for possibly having
		 * to re-align the value to the proper boundary.
		 * (This is generally a gross overestimate, but it's safe.)
		 */
		int local_size = nfl_sort[i].field_size +
		min_align_size(nfl_sort[i].field_size);
		double expansion = ((double) local_size) / input_field.field_size;
		if (expansion > conv_ptr->max_var_expansion) {
		    conv_ptr->max_var_expansion = expansion;
		}
	    }
	    break;
	default:
	    assert(FALSE);
	}
	if ((in_elements != target_elements) || 
	    (in_data_type != target_data_type)) {

	    fprintf(stderr,
		    "Requested field %s base type %s \n   differs from source type %s\n\n",
		    nfl_sort[i].field_name, nfl_sort[i].field_type,
		    input_field.field_type);
	    FFSfree_conversion(conv_ptr);
	    return NULL;
	}
	if (conv == none_required) {
	    conv = direct_to_mem;
	}
	conv_ptr->conversion_type = conv;
	memset(&conv_ptr->conversions[conv_index].src_field, 0, 
	       sizeof(conv_ptr->conversions[conv_index].src_field));
	conv_ptr->conversions[conv_index].src_field.byte_swap = byte_reversal;
	conv_ptr->conversions[conv_index].src_field.src_float_format =
	    src_float_format;
	conv_ptr->conversions[conv_index].src_field.target_float_format =
	    target_fp_format;
	conv_ptr->conversions[conv_index].subconversion = NULL;
	conv_ptr->conversions[conv_index].iovar = NULL;
	conv_ptr->conversions[conv_index].rc_swap = no_row_column_swap;
	if (column_row_swap_necessary & multi_dimen_array) {
	    if (src_ioformat->body->column_major_arrays) {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_column_major;
	    } else {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_row_major;
	    }
	}
	in_data_type = FMarray_str_to_data_type(input_field.field_type, 
					      &in_elements);
	conv_ptr->conversions[conv_index].iovar =
	    &input_var_list[input_index];
	if (in_data_type == unknown_type) {
	    FFSTypeHandle format = src_ioformat->field_subformats[input_index];
	    if (format != NULL) {
		int format_index = 0;
		char *base_type = base_data_type(input_field.field_type);

		while(target_list[format_index].format_name && 
		      (strcmp(base_type, target_list[format_index].format_name) != 0)) {
		    format_index++;
		}
		free(base_type);
	        if (format == src_ioformat) {
		    conv_ptr->conversions[conv_index].subconversion = conv_ptr;
		} else if (target_list[format_index].format_name != NULL) {
		    IOConversionPtr subconv;
		    int target_struct_size = target_list[format_index].struct_size;
		    subconv =
		      create_conversion(format,
					target_list[format_index].field_list,
					target_struct_size, pointer_size,
					byte_reversal, target_fp_format,
					conv, target_column_major,
					string_offset_size,
					converted_strings, target_list);
		    if (conv_ptr->conversions[conv_index].subconversion) {
			printf("Subconversion already had value!\n");
		    }
		    conv_ptr->conversions[conv_index].subconversion = subconv;
		}
	    } else {
		
		fprintf(stderr, "Unknown field type for field %s ->\"%s\", format %p\n",
			input_field.field_name,
			src_ioformat->body->field_list[input_index].field_type,
			src_ioformat);
		FFSfree_conversion(conv_ptr);
		return NULL;
	    }
	}
	if (input_var_list[input_index].var_array) {
	    in_elements = 1;
	}
	conv_ptr->conversions[conv_index].src_field.data_type = in_data_type;
	conv_ptr->conversions[conv_index].src_field.offset =
	    input_field.field_offset;
	conv_ptr->conversions[conv_index].src_field.size =
	    input_field.field_size;
	conv_ptr->conversions[conv_index].dest_size =
	    nfl_sort[i].field_size;
	conv_ptr->conversions[conv_index].dest_offset =
	    nfl_sort[i].field_offset;
	conv_ptr->conversions[conv_index].default_value = NULL;
	conv_ptr->conv_count = ++conv_index;
	if (default_val) {
	    free(default_val);
	    default_val = NULL;
	}
    }
    conv_ptr->conv_func = generate_conversion(conv_ptr, src_ioformat->body->alignment, 4);
    switch(conv_ptr->required_alignment) {
    case 1:
	conv_ptr->conv_func1 = conv_ptr->conv_func;
	/* falling */
    case 2:
	conv_ptr->conv_func2 = conv_ptr->conv_func;
	/* falling */
    case 4:
	conv_ptr->conv_func4 = conv_ptr->conv_func;
	/* falling */
    case 8:
    case 16:
    case 32:
    case 64:
	/* really can't imagine these currently, but... */
    case 0:
	/* zero is no conversion, so no requirement */
	break;
    default:
	fprintf(stderr, "Funky alignment, %d, for conversion %s\n",
		conv_ptr->required_alignment, 
		conv_ptr->ioformat->body->format_name);
    }
    return conv_ptr;
}